

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

Inst * __thiscall mir::inst::OpInst::deep_copy(OpInst *this)

{
  Value *val;
  Value *in_RDI;
  Op in_stack_ffffffffffffffc4;
  Value *in_stack_ffffffffffffffc8;
  Value *in_stack_ffffffffffffffd0;
  VarId *in_stack_ffffffffffffffd8;
  OpInst *in_stack_ffffffffffffffe0;
  
  val = (Value *)operator_new(0x60);
  VarId::VarId((VarId *)in_RDI,(VarId *)val);
  Value::Value(in_RDI,val);
  Value::Value(in_RDI,val);
  OpInst(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  return (Inst *)val;
}

Assistant:

Inst* deep_copy() { return new OpInst(dest, lhs, rhs, op); }